

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O2

void stackjit::Amd64Backend::convertIntToFloat(CodeGen *codeGen,FloatRegisters dest,Registers src)

{
  Registers local_1d;
  uchar local_1c [4];
  
  local_1c[3] = 0xf3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,local_1c + 3);
  local_1c[2] = 0x48;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,local_1c + 2);
  local_1c[1] = 0xf;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,local_1c + 1);
  local_1c[0] = '*';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,local_1c);
  local_1d = dest << 3 | src | 0xc0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,&local_1d);
  return;
}

Assistant:

void Amd64Backend::convertIntToFloat(CodeGen& codeGen, FloatRegisters dest, Registers src) {
		codeGen.push_back(0xf3);
		codeGen.push_back(0x48);
		codeGen.push_back(0x0f);
		codeGen.push_back(0x2a);
		codeGen.push_back((0xc0 | (Byte)src | (Byte)dest << 3));
	}